

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonTypeFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  JsonParse *pParse;
  char *zPath;
  
  uVar1 = 0;
  pParse = jsonParseFuncArg(ctx,*argv,0);
  if (pParse == (JsonParse *)0x0) {
    return;
  }
  if (argc == 2) {
    zPath = (char *)sqlite3ValueText(argv[1],'\x01');
    if (zPath == (char *)0x0) goto LAB_001b83bf;
    if (*zPath == '$') {
      uVar1 = jsonLookupStep(pParse,0,zPath + 1,0);
      if (uVar1 < 0xfffffffd) goto LAB_001b8393;
      if (uVar1 == 0xfffffffe) goto LAB_001b83bf;
      if (uVar1 != 0xfffffffd) {
        ctx->isError = 1;
        sqlite3VdbeMemSetStr
                  (ctx->pOut,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        goto LAB_001b83bf;
      }
    }
    jsonBadPathError(ctx,zPath);
  }
  else {
LAB_001b8393:
    setResultStrOrError(ctx,jsonbType[pParse->aBlob[uVar1] & 0xf],-1,'\x01',
                        (_func_void_void_ptr *)0x0);
  }
LAB_001b83bf:
  jsonParseFree(pParse);
  return;
}

Assistant:

static void jsonTypeFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  const char *zPath = 0;
  u32 i;

  p = jsonParseFuncArg(ctx, argv[0], 0);
  if( p==0 ) return;
  if( argc==2 ){
    zPath = (const char*)sqlite3_value_text(argv[1]);
    if( zPath==0 ) goto json_type_done;
    if( zPath[0]!='$' ){
      jsonBadPathError(ctx, zPath);
      goto json_type_done;
    }
    i = jsonLookupStep(p, 0, zPath+1, 0);
    if( JSON_LOOKUP_ISERROR(i) ){
      if( i==JSON_LOOKUP_NOTFOUND ){
        /* no-op */
      }else if( i==JSON_LOOKUP_PATHERROR ){
        jsonBadPathError(ctx, zPath);
      }else{
        sqlite3_result_error(ctx, "malformed JSON", -1);
      }
      goto json_type_done;
    }
  }else{
    i = 0;
  }
  sqlite3_result_text(ctx, jsonbType[p->aBlob[i]&0x0f], -1, SQLITE_STATIC);
json_type_done:
  jsonParseFree(p);
}